

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_3dm_attributes.cpp
# Opt level: O2

bool __thiscall
ON_3dmObjectAttributes::Internal_ReadV5(ON_3dmObjectAttributes *this,ON_BinaryArchive *file)

{
  bool bVar1;
  active_space aVar2;
  SectionAttributesSource source;
  SectionFillRule rule;
  SectionLabelStyle style;
  object_decoration oVar3;
  wchar_t *candidate_name;
  long lVar4;
  ON_Xform *pOVar5;
  ON_Plane *pOVar6;
  ON_Xform *pOVar7;
  ON_Plane *pOVar8;
  bool bVar9;
  byte bVar10;
  uchar itemid;
  int minor_version;
  bool clipping_proof;
  int major_version;
  ON_wString name;
  
  bVar10 = 0;
  itemid = 0xff;
  major_version = 0;
  minor_version = 0;
  bVar1 = ON_BinaryArchive::Read3dmChunkVersion(file,&major_version,&minor_version);
  if (!bVar1) {
    return false;
  }
  if (major_version != 2) {
    return false;
  }
  bVar1 = ON_BinaryArchive::ReadUuid(file,&this->m_uuid);
  if (!bVar1) {
    return false;
  }
  bVar1 = ON_BinaryArchive::Read3dmReferencedComponentIndex(file,Layer,&this->m_layer_index);
  if (!bVar1) {
    return false;
  }
  bVar1 = ON_BinaryArchive::ReadChar(file,&itemid);
  if (itemid == '\0' || !bVar1) goto LAB_0039f6a5;
  if (itemid == '\x01') {
    ON_wString::ON_wString(&name);
    bVar1 = ON_BinaryArchive::ReadString(file,&name);
    if (bVar1) {
      candidate_name = ON_wString::operator_cast_to_wchar_t_(&name);
      SetName(this,candidate_name,true);
      bVar1 = ON_BinaryArchive::ReadChar(file,&itemid);
      bVar9 = itemid != '\0' && bVar1;
    }
    else {
      bVar1 = false;
      bVar9 = false;
    }
    ON_wString::~ON_wString(&name);
    if (!bVar9) goto LAB_0039f6a5;
  }
  else {
    bVar1 = true;
  }
  if (itemid == '\x02') {
    bVar1 = ON_BinaryArchive::ReadString(file,&this->m_url);
    if (!bVar1) {
      return false;
    }
    bVar1 = ON_BinaryArchive::ReadChar(file,&itemid);
    if (itemid == '\0' || !bVar1) goto LAB_0039f6a5;
    bVar1 = true;
  }
  if (itemid == '\x03') {
    bVar1 = ON_BinaryArchive::Read3dmReferencedComponentIndex
                      (file,LinePattern,&this->m_linetype_index);
    if (!bVar1) {
      return false;
    }
    bVar1 = ON_BinaryArchive::ReadChar(file,&itemid);
    if (itemid == '\0' || !bVar1) goto LAB_0039f6a5;
    bVar1 = true;
  }
  if (itemid == '\x04') {
    bVar1 = ON_BinaryArchive::Read3dmReferencedComponentIndex(file,Material,&this->m_material_index)
    ;
    if (!bVar1) {
      return false;
    }
    bVar1 = ON_BinaryArchive::ReadChar(file,&itemid);
    if (itemid == '\0' || !bVar1) goto LAB_0039f6a5;
    bVar1 = true;
  }
  if (itemid == '\x05') {
    bVar1 = ON_ObjectRenderingAttributes::Read(&this->m_rendering_attributes,file);
    if (!bVar1) {
      return false;
    }
    bVar1 = ON_BinaryArchive::ReadChar(file,&itemid);
    if (itemid == '\0' || !bVar1) goto LAB_0039f6a5;
    bVar1 = true;
  }
  if (itemid == '\x06') {
    bVar1 = ON_BinaryArchive::ReadColor(file,&this->m_color);
    if (!bVar1) {
      return false;
    }
    bVar1 = ON_BinaryArchive::ReadChar(file,&itemid);
    if (itemid == '\0' || !bVar1) goto LAB_0039f6a5;
    bVar1 = true;
  }
  if (itemid == '\a') {
    bVar1 = ON_BinaryArchive::ReadColor(file,&this->m_plot_color);
    if (!bVar1) {
      return false;
    }
    bVar1 = ON_BinaryArchive::ReadChar(file,&itemid);
    if (itemid == '\0' || !bVar1) goto LAB_0039f6a5;
    bVar1 = true;
  }
  if (itemid == '\b') {
    bVar1 = ON_BinaryArchive::ReadDouble(file,&this->m_plot_weight_mm);
    if (!bVar1) {
      return false;
    }
    bVar1 = ON_BinaryArchive::ReadChar(file,&itemid);
    if (itemid == '\0' || !bVar1) goto LAB_0039f6a5;
    bVar1 = true;
  }
  if (itemid == '\t') {
    name.m_s = name.m_s & 0xffffffffffffff00;
    bVar1 = ON_BinaryArchive::ReadChar(file,(ON__UINT8 *)&name);
    if (bVar1) {
      oVar3 = ON::ObjectDecoration((uint)(byte)name.m_s);
      this->m_object_decoration = oVar3;
      bVar1 = ON_BinaryArchive::ReadChar(file,&itemid);
      if (!bVar1 || itemid == '\0') goto LAB_0039f6a5;
      bVar1 = true;
      goto LAB_0039eb65;
    }
LAB_0039f6a3:
    bVar1 = false;
  }
  else {
LAB_0039eb65:
    if (itemid == '\n') {
      bVar1 = ON_BinaryArchive::ReadInt(file,&this->m_wire_density);
      if (!bVar1) {
        return false;
      }
      bVar1 = ON_BinaryArchive::ReadChar(file,&itemid);
      if (itemid == '\0' || !bVar1) goto LAB_0039f6a5;
      bVar1 = true;
    }
    if (itemid == '\v') {
      bVar1 = ON_BinaryArchive::ReadBool(file,&this->m_bVisible);
      if (!bVar1) {
        return false;
      }
      bVar1 = ON_BinaryArchive::ReadChar(file,&itemid);
      if (itemid == '\0' || !bVar1) goto LAB_0039f6a5;
      bVar1 = true;
    }
    if (itemid == '\f') {
      bVar1 = ON_BinaryArchive::ReadChar(file,&this->m_mode);
      if (!bVar1) {
        return false;
      }
      bVar1 = ON_BinaryArchive::ReadChar(file,&itemid);
      if (itemid == '\0' || !bVar1) goto LAB_0039f6a5;
      bVar1 = true;
    }
    if (itemid == '\r') {
      bVar1 = ON_BinaryArchive::ReadChar(file,&this->m_color_source);
      if (!bVar1) {
        return false;
      }
      bVar1 = ON_BinaryArchive::ReadChar(file,&itemid);
      if (itemid == '\0' || !bVar1) goto LAB_0039f6a5;
      bVar1 = true;
    }
    if (itemid == '\x0e') {
      bVar1 = ON_BinaryArchive::ReadChar(file,&this->m_plot_color_source);
      if (!bVar1) {
        return false;
      }
      bVar1 = ON_BinaryArchive::ReadChar(file,&itemid);
      if (itemid == '\0' || !bVar1) goto LAB_0039f6a5;
      bVar1 = true;
    }
    if (itemid == '\x0f') {
      bVar1 = ON_BinaryArchive::ReadChar(file,&this->m_plot_weight_source);
      if (!bVar1) {
        return false;
      }
      bVar1 = ON_BinaryArchive::ReadChar(file,&itemid);
      if (itemid == '\0' || !bVar1) goto LAB_0039f6a5;
      bVar1 = true;
    }
    if (itemid == '\x10') {
      bVar1 = ON_BinaryArchive::ReadChar(file,&this->m_material_source);
      if (!bVar1) {
        return false;
      }
      bVar1 = ON_BinaryArchive::ReadChar(file,&itemid);
      if (itemid == '\0' || !bVar1) goto LAB_0039f6a5;
      bVar1 = true;
    }
    if (itemid == '\x11') {
      bVar1 = ON_BinaryArchive::ReadChar(file,&this->m_linetype_source);
      if (!bVar1) {
        return false;
      }
      bVar1 = ON_BinaryArchive::ReadChar(file,&itemid);
      if (itemid == '\0' || !bVar1) goto LAB_0039f6a5;
      bVar1 = true;
    }
    if (itemid == '\x12') {
      bVar1 = ON_BinaryArchive::Read3dmReferencedComponentIndexArray(file,Group,&this->m_group);
      if (!bVar1) {
        return false;
      }
      bVar1 = ON_BinaryArchive::ReadChar(file,&itemid);
      if (itemid == '\0' || !bVar1) goto LAB_0039f6a5;
      bVar1 = true;
    }
    if (itemid == '\x13') {
      name.m_s = name.m_s & 0xffffffffffffff00;
      bVar1 = ON_BinaryArchive::ReadChar(file,(ON__UINT8 *)&name);
      if (!bVar1) goto LAB_0039f6a3;
      aVar2 = ON::ActiveSpace((uint)(byte)name.m_s);
      this->m_space = aVar2;
      bVar1 = ON_BinaryArchive::ReadChar(file,&itemid);
      if (!bVar1 || itemid == '\0') goto LAB_0039f6a5;
      bVar1 = true;
    }
    if (itemid == '\x14') {
      bVar1 = ON_BinaryArchive::ReadUuid(file,&this->m_viewport_id);
      if (!bVar1) {
        return false;
      }
      bVar1 = ON_BinaryArchive::ReadChar(file,&itemid);
      if (itemid == '\0' || !bVar1) goto LAB_0039f6a5;
      bVar1 = true;
    }
    if (itemid == '\x15') {
      bVar1 = ON_BinaryArchive::ReadArray(file,&this->m_dmref);
      if (!bVar1) {
        return false;
      }
      bVar1 = ON_BinaryArchive::ReadChar(file,&itemid);
      if (minor_version < 1 || (itemid == '\0' || !bVar1)) goto LAB_0039f6a5;
    }
    else if (minor_version < 1) goto LAB_0039f6a5;
    if (itemid == '\x16') {
      bVar1 = ON_BinaryArchive::ReadInt(file,&this->m_display_order);
      if (!bVar1) {
        return false;
      }
      bVar1 = ON_BinaryArchive::ReadChar(file,&itemid);
      if (((!bVar1) || (itemid == '\0')) || (minor_version < 2)) goto LAB_0039f6a5;
    }
    else if ((uint)minor_version < 2) goto LAB_0039f6a5;
    if (itemid == '\x17') {
      name.m_s = name.m_s & 0xffffffffffffff00;
      bVar1 = ON_BinaryArchive::ReadChar(file,(ON__UINT8 *)&name);
      if (!bVar1) goto LAB_0039f6a3;
      bVar1 = ON_BinaryArchive::ReadChar(file,&itemid);
      if (!bVar1 || itemid == '\0') goto LAB_0039f6a5;
      bVar1 = true;
    }
    if (itemid == '\x18') {
      name.m_s = name.m_s & 0xffffffffffffff00;
      bVar1 = ON_BinaryArchive::ReadChar(file,(ON__UINT8 *)&name);
      if (!bVar1) goto LAB_0039f6a3;
      bVar1 = ON_BinaryArchive::ReadChar(file,&itemid);
      if (!bVar1 || itemid == '\0') goto LAB_0039f6a5;
      bVar1 = true;
    }
    if (itemid == '\x19') {
      name.m_s = name.m_s & 0xffffffffffffff00;
      bVar1 = ON_BinaryArchive::ReadChar(file,(ON__UINT8 *)&name);
      if (!bVar1) goto LAB_0039f6a3;
      bVar1 = ON_BinaryArchive::ReadChar(file,&itemid);
      if (!bVar1 || itemid == '\0') goto LAB_0039f6a5;
      bVar1 = true;
    }
    if (itemid == '\x1a') {
      name.m_s = name.m_s & 0xffffffffffffff00;
      bVar1 = ON_BinaryArchive::ReadChar(file,(ON__UINT8 *)&name);
      if (!bVar1) goto LAB_0039f6a3;
      bVar1 = ON_BinaryArchive::ReadChar(file,&itemid);
      if (!bVar1 || itemid == '\0') goto LAB_0039f6a5;
      bVar1 = true;
    }
    if (minor_version < 3) goto LAB_0039f6a5;
    if (itemid == '\x1b') {
      name.m_s = name.m_s & 0xffffffffffffff00;
      bVar1 = ON_BinaryArchive::ReadChar(file,(ON__UINT8 *)&name);
      if (!bVar1) goto LAB_0039f6a3;
      bVar1 = ON_BinaryArchive::ReadChar(file,&itemid);
      if (!bVar1 || itemid == '\0') goto LAB_0039f6a5;
      bVar1 = true;
    }
    if (itemid == '\x1c') {
      _clipping_proof = (double)((ulong)_clipping_proof & 0xffffffffffffff00);
      bVar1 = ON_BinaryArchive::ReadBool(file,&clipping_proof);
      if (!bVar1) {
        return false;
      }
      ON_UuidList::ON_UuidList((ON_UuidList *)&name);
      bVar1 = ON_UuidList::Read((ON_UuidList *)&name,file);
      if (bVar1) {
        bVar1 = ON_BinaryArchive::ReadChar(file,&itemid);
        bVar9 = itemid != '\0' && bVar1;
      }
      else {
        bVar1 = false;
        bVar9 = false;
      }
      ON_UuidList::~ON_UuidList((ON_UuidList *)&name);
      if (!bVar9) goto LAB_0039f6a5;
    }
    if (minor_version < 4) goto LAB_0039f6a5;
    if (itemid == '\x1d') {
      name.m_s = name.m_s & 0xffffffffffffff00;
      bVar1 = ON_BinaryArchive::ReadChar(file,(ON__UINT8 *)&name);
      if (!bVar1) goto LAB_0039f6a3;
      source = ON::SectionAttributesSourceFromUnsigned((uint)(byte)name.m_s);
      SetSectionAttributesSource(this,source);
      bVar1 = ON_BinaryArchive::ReadChar(file,&itemid);
      if (!bVar1 || itemid == '\0') goto LAB_0039f6a5;
      bVar1 = true;
    }
    if (itemid == '\x1e') {
      _clipping_proof = (double)((ulong)_clipping_proof & 0xffffffff00000000);
      bVar1 = ON_BinaryArchive::Read3dmReferencedComponentIndex
                        (file,HatchPattern,(int *)&clipping_proof);
      if (!bVar1) goto LAB_0039f6a3;
      ON_SectionStyle::ON_SectionStyle((ON_SectionStyle *)&name);
      CustomSectionStyle(this,(ON_SectionStyle *)&name);
      ON_SectionStyle::SetHatchIndex((ON_SectionStyle *)&name,_clipping_proof);
      SetCustomSectionStyle(this,(ON_SectionStyle *)&name);
      bVar1 = ON_BinaryArchive::ReadChar(file,&itemid);
      bVar9 = itemid == '\0';
      ON_SectionStyle::~ON_SectionStyle((ON_SectionStyle *)&name);
      if (!bVar1 || bVar9) goto LAB_0039f6a5;
      bVar1 = true;
    }
    if (itemid == '\x1f') {
      _clipping_proof = 1.0;
      bVar1 = ON_BinaryArchive::ReadDouble(file,(double *)&clipping_proof);
      if (!bVar1) goto LAB_0039f6a3;
      ON_SectionStyle::ON_SectionStyle((ON_SectionStyle *)&name);
      CustomSectionStyle(this,(ON_SectionStyle *)&name);
      ON_SectionStyle::SetHatchScale((ON_SectionStyle *)&name,_clipping_proof);
      SetCustomSectionStyle(this,(ON_SectionStyle *)&name);
      bVar1 = ON_BinaryArchive::ReadChar(file,&itemid);
      bVar9 = itemid == '\0';
      ON_SectionStyle::~ON_SectionStyle((ON_SectionStyle *)&name);
      if (!bVar1 || bVar9) goto LAB_0039f6a5;
      bVar1 = true;
    }
    if (itemid == ' ') {
      _clipping_proof = 0.0;
      bVar1 = ON_BinaryArchive::ReadDouble(file,(double *)&clipping_proof);
      if (!bVar1) goto LAB_0039f6a3;
      ON_SectionStyle::ON_SectionStyle((ON_SectionStyle *)&name);
      CustomSectionStyle(this,(ON_SectionStyle *)&name);
      ON_SectionStyle::SetHatchRotation((ON_SectionStyle *)&name,_clipping_proof);
      SetCustomSectionStyle(this,(ON_SectionStyle *)&name);
      bVar1 = ON_BinaryArchive::ReadChar(file,&itemid);
      bVar9 = itemid == '\0';
      ON_SectionStyle::~ON_SectionStyle((ON_SectionStyle *)&name);
      if (!bVar1 || bVar9) goto LAB_0039f6a5;
      bVar1 = true;
    }
    if (minor_version < 5) goto LAB_0039f6a5;
    if (itemid == '!') {
      name.m_s = (wchar_t *)0x3ff0000000000000;
      bVar1 = ON_BinaryArchive::ReadDouble(file,(double *)&name);
      if (!bVar1) goto LAB_0039f6a3;
      SetLinetypePatternScale(this,(double)name.m_s);
      bVar1 = ON_BinaryArchive::ReadChar(file,&itemid);
      if (!bVar1 || itemid == '\0') goto LAB_0039f6a5;
      bVar1 = true;
    }
    if (minor_version < 6) goto LAB_0039f6a5;
    if (itemid == '\"') {
      name.m_s._0_4_ = (ON_Color)(ON_Color)ON_Color::UnsetColor.field_0;
      bVar1 = ON_BinaryArchive::ReadColor(file,(ON_Color *)&name);
      if (!bVar1) goto LAB_0039f6a3;
      SetHatchBackgroundFillColor(this,(ON_Color *)&name);
      bVar1 = ON_BinaryArchive::ReadChar(file,&itemid);
      if (!bVar1 || itemid == '\0') goto LAB_0039f6a5;
      bVar1 = true;
    }
    if (itemid == '#') {
      name.m_s = name.m_s & 0xffffffffffffff00;
      bVar1 = ON_BinaryArchive::ReadBool(file,(bool *)&name);
      if (!bVar1) goto LAB_0039f6a3;
      SetHatchBoundaryVisible(this,(bool)(byte)name.m_s);
      bVar1 = ON_BinaryArchive::ReadChar(file,&itemid);
      if (!bVar1 || itemid == '\0') goto LAB_0039f6a5;
      bVar1 = true;
    }
    if (minor_version < 8) goto LAB_0039f6a5;
    if (itemid == '$') {
      pOVar5 = &ON_Xform::Nan;
      pOVar7 = (ON_Xform *)&name;
      for (lVar4 = 0x10; lVar4 != 0; lVar4 = lVar4 + -1) {
        pOVar7->m_xform[0][0] = pOVar5->m_xform[0][0];
        pOVar5 = (ON_Xform *)((long)pOVar5 + ((ulong)bVar10 * -2 + 1) * 8);
        pOVar7 = (ON_Xform *)((long)pOVar7 + ((ulong)bVar10 * -2 + 1) * 8);
      }
      bVar1 = ON_BinaryArchive::ReadXform(file,(ON_Xform *)&name);
      if (!bVar1) goto LAB_0039f6a3;
      pOVar6 = &ON_Plane::World_xy;
      pOVar8 = &this->m_object_frame;
      for (lVar4 = 0x10; lVar4 != 0; lVar4 = lVar4 + -1) {
        (pOVar8->origin).x = (pOVar6->origin).x;
        pOVar6 = (ON_Plane *)((long)pOVar6 + ((ulong)bVar10 * -2 + 1) * 8);
        pOVar8 = (ON_Plane *)((long)pOVar8 + (ulong)bVar10 * -0x10 + 8);
      }
      ON_Plane::Transform(&this->m_object_frame,(ON_Xform *)&name);
      bVar1 = ON_BinaryArchive::ReadChar(file,&itemid);
      if (!bVar1 || itemid == '\0') goto LAB_0039f6a5;
      bVar1 = true;
    }
    if (minor_version < 9) goto LAB_0039f6a5;
    if (itemid == '%') {
      _clipping_proof = (double)((ulong)_clipping_proof & 0xffffffffffffff00);
      bVar1 = ON_BinaryArchive::ReadChar(file,&clipping_proof);
      if (!bVar1) goto LAB_0039f6a3;
      ON_SectionStyle::ON_SectionStyle((ON_SectionStyle *)&name);
      CustomSectionStyle(this,(ON_SectionStyle *)&name);
      rule = ON::SectionFillRuleFromUnsigned((uint)clipping_proof);
      ON_SectionStyle::SetSectionFillRule((ON_SectionStyle *)&name,rule);
      bVar1 = ON_BinaryArchive::ReadChar(file,&itemid);
      bVar9 = itemid == '\0';
      ON_SectionStyle::~ON_SectionStyle((ON_SectionStyle *)&name);
      if (!bVar1 || bVar9) goto LAB_0039f6a5;
      bVar1 = true;
    }
    if (minor_version < 10) goto LAB_0039f6a5;
    if (itemid == '&') {
      ON_Linetype::ON_Linetype((ON_Linetype *)&name);
      bVar1 = ON_Linetype::Read((ON_Linetype *)&name,file);
      if (bVar1) {
        SetCustomLinetype(this,(ON_Linetype *)&name);
        bVar1 = ON_BinaryArchive::ReadChar(file,&itemid);
        bVar9 = itemid != '\0' && bVar1;
      }
      else {
        bVar1 = false;
        bVar9 = false;
      }
      ON_Linetype::~ON_Linetype((ON_Linetype *)&name);
      if (!bVar9) goto LAB_0039f6a5;
    }
    if (minor_version < 0xb) goto LAB_0039f6a5;
    if (itemid == '\'') {
      ON_SectionStyle::ON_SectionStyle((ON_SectionStyle *)&name);
      bVar1 = ON_SectionStyle::Read((ON_SectionStyle *)&name,file);
      if (bVar1) {
        SetCustomSectionStyle(this,(ON_SectionStyle *)&name);
        bVar1 = ON_BinaryArchive::ReadChar(file,&itemid);
        bVar9 = itemid != '\0' && bVar1;
      }
      else {
        bVar1 = false;
        bVar9 = false;
      }
      ON_SectionStyle::~ON_SectionStyle((ON_SectionStyle *)&name);
      if (!bVar9) goto LAB_0039f6a5;
    }
    if (minor_version < 0xc) goto LAB_0039f6a5;
    if (itemid == '(') {
      name.m_s = name.m_s & 0xffffffffffffff00;
      bVar1 = ON_BinaryArchive::ReadChar(file,(ON__UINT8 *)&name);
      if (!bVar1) goto LAB_0039f6a3;
      style = ON::SectionLabelStyleFromUnsigned((uint)(byte)name.m_s);
      SetClippingPlaneLabelStyle(this,style);
      bVar1 = ON_BinaryArchive::ReadChar(file,&itemid);
      if (!bVar1 || itemid == '\0') goto LAB_0039f6a5;
      bVar1 = true;
    }
    if (minor_version < 0xd) goto LAB_0039f6a5;
    if (itemid == ')') {
      name.m_s._0_1_ = 1;
      bVar1 = ON_BinaryArchive::ReadBool(file,(bool *)&name);
      if (!bVar1) goto LAB_0039f6a3;
      bVar1 = ON_BinaryArchive::ReadChar(file,&itemid);
      if (!bVar1 || itemid == '\0') goto LAB_0039f6a5;
      bVar1 = true;
    }
    if (0x29 < itemid && 0xd < minor_version) {
      itemid = '\0';
    }
  }
LAB_0039f6a5:
  if ((bVar1 != false) && (itemid != '\0')) {
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_3dm_attributes.cpp"
               ,0x392,"","Bug in ON_3dmObjectAttributes::ReadV5Helper or WriteV5Helper");
    bVar1 = true;
  }
  return bVar1;
}

Assistant:

bool ON_3dmObjectAttributes::Internal_ReadV5( ON_BinaryArchive& file )
{
  unsigned char itemid = 0xFF;
  int major_version = 0;
  int minor_version = 0;
  bool rc = file.Read3dmChunkVersion(&major_version,&minor_version);
  if ( rc && 2 != major_version )
    rc = false;

  while(rc)
  {
    if (!rc) break;
    rc = file.ReadUuid(m_uuid);
    if (!rc) break;
    //rc = file.ReadInt(&m_layer_index);
    rc = file.Read3dmReferencedComponentIndex(ON_ModelComponent::Type::Layer, &m_layer_index);
    if (!rc) break;

    // read non-default settings - skip everything else
    rc = file.ReadChar(&itemid);
    if (!rc) break;
    if ( 0 == itemid )
      break;
    
    if ( 1 == itemid )
    {
      ON_wString name;
      rc = file.ReadString(name);
      if (!rc) break;
      SetName(name,true);

      rc = file.ReadChar(&itemid);
      if ( !rc || 0 == itemid ) break;
    }
    if ( 2 == itemid )
    {
      rc = file.ReadString(m_url);
      if (!rc) break;
      rc = file.ReadChar(&itemid);
      if ( !rc || 0 == itemid ) break;
    }
    if ( 3 == itemid )
    {
      //rc = file.ReadInt(&m_linetype_index);
      rc = file.Read3dmReferencedComponentIndex(ON_ModelComponent::Type::LinePattern, &m_linetype_index);
      if (!rc) break;
      rc = file.ReadChar(&itemid);
      if ( !rc || 0 == itemid ) break;
    }
    if ( 4 == itemid )
    {
      //rc = file.ReadInt(&m_material_index);
      rc = file.Read3dmReferencedComponentIndex(ON_ModelComponent::Type::RenderMaterial, &m_material_index);
      if (!rc) break;
      rc = file.ReadChar(&itemid);
      if ( !rc || 0 == itemid ) break;
    }
    if ( 5 == itemid )
    {
      rc = m_rendering_attributes.Read(file);
      if (!rc) break;
      rc = file.ReadChar(&itemid);
      if ( !rc || 0 == itemid ) break;
    }
    if ( 6 == itemid )
    {
      rc = file.ReadColor(m_color);
      if (!rc) break;
      rc = file.ReadChar(&itemid);
      if ( !rc || 0 == itemid ) break;
    }
    if ( 7 == itemid )
    {
      rc = file.ReadColor(m_plot_color);
      if (!rc) break;
      rc = file.ReadChar(&itemid);
      if ( !rc || 0 == itemid ) break;
    }
    if ( 8 == itemid )
    {
      rc = file.ReadDouble(&m_plot_weight_mm);
      if (!rc) break;
      rc = file.ReadChar(&itemid);
      if ( !rc || 0 == itemid ) break;
    }
    if ( 9 == itemid )
    {
      unsigned char c = 0;
      rc = file.ReadChar(&c);
      if (!rc) break;
      m_object_decoration = ON::ObjectDecoration(c);
      rc = file.ReadChar(&itemid);
      if ( !rc || 0 == itemid ) break;
    }
    if ( 10 == itemid )
    {
      rc = file.ReadInt(&m_wire_density);
      if (!rc) break;
      rc = file.ReadChar(&itemid);
      if ( !rc || 0 == itemid ) break;
    }
    if ( 11 == itemid )
    {
      rc = file.ReadBool(&m_bVisible);
      if (!rc) break;
      rc = file.ReadChar(&itemid);
      if ( !rc || 0 == itemid ) break;
    }
    if ( 12 == itemid )
    {
      rc = file.ReadChar(&m_mode);
      if (!rc) break;
      rc = file.ReadChar(&itemid);
      if ( !rc || 0 == itemid ) break;
    }
    if ( 13 == itemid )
    {
      rc = file.ReadChar(&m_color_source);
      if (!rc) break;
      rc = file.ReadChar(&itemid);
      if ( !rc || 0 == itemid ) break;
    }
    if ( 14 == itemid )
    {
      rc = file.ReadChar(&m_plot_color_source);
      if (!rc) break;
      rc = file.ReadChar(&itemid);
      if ( !rc || 0 == itemid ) break;
    }
    if ( 15 == itemid )
    {
      rc = file.ReadChar(&m_plot_weight_source);
      if (!rc) break;
      rc = file.ReadChar(&itemid);
      if ( !rc || 0 == itemid ) break;
    }
    if ( 16 == itemid )
    {
      rc = file.ReadChar(&m_material_source);
      if (!rc) break;
      rc = file.ReadChar(&itemid);
      if ( !rc || 0 == itemid ) break;
    }
    if ( 17 == itemid )
    {
      rc = file.ReadChar(&m_linetype_source);
      if (!rc) break;
      rc = file.ReadChar(&itemid);
      if ( !rc || 0 == itemid ) break;
    }
    if ( 18 == itemid )
    {
      rc = file.Read3dmReferencedComponentIndexArray(ON_ModelComponent::Type::Group, m_group);
      if (!rc) break;
      rc = file.ReadChar(&itemid);
      if ( !rc || 0 == itemid ) break;
    }
    if ( 19 == itemid )
    {
      unsigned char c = 0;
      rc = file.ReadChar(&c);
      if (!rc) break;
      m_space = ON::ActiveSpace(c);
      rc = file.ReadChar(&itemid);
      if ( !rc || 0 == itemid ) break;
    }
    if ( 20 == itemid )
    {
      rc = file.ReadUuid(m_viewport_id);
      if (!rc) break;
      rc = file.ReadChar(&itemid);
      if ( !rc || 0 == itemid ) break;
    }
    if ( 21 == itemid )
    {
      rc = file.ReadArray(m_dmref);
      if (!rc) break;
      rc = file.ReadChar(&itemid);
      if ( !rc || 0 == itemid ) break;
    }

    // items 1 - 21 are in chunk version 2.0 files
    if ( minor_version <= 0 )
      break;

    // 28 Nov. 2009 - S. Baer
    // Added m_display_order to version 2.1 files
    if ( 22 == itemid )
    {
      rc = file.ReadInt(&m_display_order);
      if (!rc) break;
      rc = file.ReadChar(&itemid);
      if ( !rc || 0 == itemid ) break;
    }

    if ( minor_version <= 1 )
      break;

    // 12 Aug 2021 S. Baer
    // Items 23, 24, 25, 26 were in a version of Rhino 8 WIP for about 24 hours.
    // They were most likely never used by anyone, but just in case let's test,
    // read, and throw away.
    if (ON_3dmObjectAttributesTypeCodes::ObsoleteLineCapStyleSource == itemid) //23
    {
      unsigned char source = 0;
      rc = file.ReadChar(&source);
      if (!rc) break;
      //SetLineCapStyleSource(ON::ObjectLineCapStyleSourceFromUnsigned(source));
      rc = file.ReadChar(&itemid);
      if (!rc || 0 == itemid) break;
    }

    if (ON_3dmObjectAttributesTypeCodes::ObsoleteLineCapStyle == itemid) //24
    {
      unsigned char style = 0;
      rc = file.ReadChar(&style);
      if (!rc) break;
      //SetLineCapStyle(ON::LineCapStyleFromUnsigned(style));
      rc = file.ReadChar(&itemid);
      if (!rc || 0 == itemid) break;
    }

    if (ON_3dmObjectAttributesTypeCodes::ObsoleteLineJoinStyleSource == itemid) //25
    {
      unsigned char source = 0;
      rc = file.ReadChar(&source);
      if (!rc) break;
      //SetLineJoinStyleSource(ON::ObjectLineJoinStyleSourceFromUnsigned(source));
      rc = file.ReadChar(&itemid);
      if (!rc || 0 == itemid) break;
    }

    if (ON_3dmObjectAttributesTypeCodes::ObsoleteLineJoinStyle == itemid) //26
    {
      unsigned char style = 0;
      rc = file.ReadChar(&style);
      if (!rc) break;
      //SetLineJoinStyle(ON::LineJoinStyleFromUnsigned(style));
      rc = file.ReadChar(&itemid);
      if (!rc || 0 == itemid) break;
    }

    if (minor_version <= 2)
      break;

    if (ON_3dmObjectAttributesTypeCodes::ObsoleteClipParticipationSource == itemid) //27
    {
      unsigned char clip_participation_source = 0;
      rc = file.ReadChar(&clip_participation_source);
      if (!rc) break;
      //SetClipParticipationSource(ON::ClipParticipationSourceFromUnsigned(clip_participation_source));
      rc = file.ReadChar(&itemid);
      if (!rc || 0 == itemid) break;
    }

    if (ON_3dmObjectAttributesTypeCodes::SelectiveClippingData == itemid) //28
    {
      bool clipping_proof = false;
      rc = file.ReadBool(&clipping_proof);
      if (!rc) break;
      ON_UuidList selectiveClipping;
      rc = selectiveClipping.Read(file);
      if (!rc) break;
      //if (clipping_proof)
      //  SetClipParticipationForNone();
      //else
      //{
      //  if (selectiveClipping.Count() > 0)
      //  {
      //    SetClipParticipationList(selectiveClipping.Array(), selectiveClipping.Count(), true);
      //  }
      //}
      rc = file.ReadChar(&itemid);
      if (!rc || 0 == itemid) break;
    }

    if (minor_version <= 3)
      break;

    if (ON_3dmObjectAttributesTypeCodes::SectionAttributesSource == itemid) //29
    {
      unsigned char section_attr_source = 0;
      rc = file.ReadChar(&section_attr_source);
      if (!rc) break;
      SetSectionAttributesSource(ON::SectionAttributesSourceFromUnsigned(section_attr_source));
      rc = file.ReadChar(&itemid);
      if (!rc || 0 == itemid) break;
    }
    if (ON_3dmObjectAttributesTypeCodes::SectionHatchIndex == itemid) //30
    {
      int hatch_index = 0;
      rc = file.Read3dmReferencedComponentIndex(ON_ModelComponent::Type::HatchPattern, &hatch_index);
      if (!rc) break;
      ON_SectionStyle ss;
      CustomSectionStyle(&ss);
      ss.SetHatchIndex(hatch_index);
      SetCustomSectionStyle(ss);
      rc = file.ReadChar(&itemid);
      if (!rc || 0 == itemid) break;
    }
    if (ON_3dmObjectAttributesTypeCodes::SectionHatchScale == itemid) //31
    {
      double hatch_scale = 1;
      rc = file.ReadDouble(&hatch_scale);
      if (!rc) break;
      ON_SectionStyle ss;
      CustomSectionStyle(&ss);
      ss.SetHatchScale(hatch_scale);
      SetCustomSectionStyle(ss);
      rc = file.ReadChar(&itemid);
      if (!rc || 0 == itemid) break;
    }
    if (ON_3dmObjectAttributesTypeCodes::SectionHatchRotation == itemid) //32
    {
      double hatch_rotation = 0;
      rc = file.ReadDouble(&hatch_rotation);
      if (!rc) break;
      ON_SectionStyle ss;
      CustomSectionStyle(&ss);
      ss.SetHatchRotation(hatch_rotation);
      SetCustomSectionStyle(ss);
      rc = file.ReadChar(&itemid);
      if (!rc || 0 == itemid) break;
    }

    if (minor_version <= 4)
      break;

    if (ON_3dmObjectAttributesTypeCodes::LinetypeScale == itemid) //33
    {
      double scale = 1.0;
      rc = file.ReadDouble(&scale);
      if (!rc) break;
      SetLinetypePatternScale(scale);
      rc = file.ReadChar(&itemid);
      if (!rc || 0 == itemid) break;
    }

    if (minor_version <= 5)
      break;

    if (ON_3dmObjectAttributesTypeCodes::HatchBackgroundFill == itemid) // 34
    {
      ON_Color color = ON_Color::UnsetColor;
      rc = file.ReadColor(color);
      if (!rc) break;
      SetHatchBackgroundFillColor(color);
      rc = file.ReadChar(&itemid);
      if (!rc || 0 == itemid) break;
    }

    if (ON_3dmObjectAttributesTypeCodes::HatchBoundaryVisible == itemid) // 35
    {
      bool visible = false;
      rc = file.ReadBool(&visible);
      if (!rc) break;
      SetHatchBoundaryVisible(visible);
      rc = file.ReadChar(&itemid);
      if (!rc || 0 == itemid) break;
    }

    if (minor_version <= 6)
      break;

    // nothing added in 2.7
    if (minor_version <= 7)
      break;

    if (ON_3dmObjectAttributesTypeCodes::ObjectFrame == itemid) // 36
    {
      ON_Xform object_frame = ON_Xform::Nan;
      rc = file.ReadXform(object_frame);
      if (!rc) break;

      m_object_frame = ON_Plane::World_xy;
      m_object_frame.Transform(object_frame);

      rc = file.ReadChar(&itemid);
      if (!rc || 0 == itemid) break;
    }

    if (minor_version <= 8)
      break;

    if (ON_3dmObjectAttributesTypeCodes::SectionFillRule == itemid) // 37
    {
      unsigned char c = 0;
      rc = file.ReadChar(&c);
      if (!rc) break;
      ON_SectionStyle ss;
      CustomSectionStyle(&ss);
      ss.SetSectionFillRule(ON::SectionFillRuleFromUnsigned(c));

      rc = file.ReadChar(&itemid);
      if (!rc || 0 == itemid) break;
    }

    if (minor_version <= 9)
      break;

    if (ON_3dmObjectAttributesTypeCodes::CustomLinetype == itemid) // 38
    {
      ON_Linetype lt;
      rc = lt.Read(file);
      if (!rc) break;

      SetCustomLinetype(lt);

      rc = file.ReadChar(&itemid);
      if (!rc || 0 == itemid) break;
    }

    if (minor_version <= 10)
      break;

    if (ON_3dmObjectAttributesTypeCodes::CustomSectionStyle == itemid) // 39
    {
      ON_SectionStyle sectionStyle;
      rc = sectionStyle.Read(file);
      if (!rc) break;

      SetCustomSectionStyle(sectionStyle);

      rc = file.ReadChar(&itemid);
      if (!rc || 0 == itemid) break;
    }

    if (minor_version <= 11)
      break;

    if (ON_3dmObjectAttributesTypeCodes::ClippingPlaneLabelStyle == itemid) // 40
    {
      unsigned char c = 0;
      rc = file.ReadChar(&c);
      if (!rc) break;
      SetClippingPlaneLabelStyle(ON::SectionLabelStyleFromUnsigned(c));

      rc = file.ReadChar(&itemid);
      if (!rc || 0 == itemid) break;
    }

    if (minor_version <= 12)
      break;

    if (ON_3dmObjectAttributesTypeCodes::ObsoleteSelectiveClippingListType == itemid) // 41
    {
      bool b = true;
      rc = file.ReadBool(&b);
      if (!rc) break;
      //if (nullptr == m_private)
      //  m_private = new ON_3dmObjectAttributesPrivate(this);
      //m_private->m_clipplane_list_is_participation = b;

      rc = file.ReadChar(&itemid);
      if (!rc || 0 == itemid) break;
    }

    if (minor_version <= 13)
      break;

    // Add new item reading above and increment the LastAttributeTypeCode value
    // in the enum. Be sure to test reading of old and new files by old and new
    // code, before checking in your changes.
    //
    if ( itemid > ON_3dmObjectAttributesTypeCodes::LastAttributeTypeCode )
    {
      // we are reading file written with code newer
      // than this code (minor_version > 2)
      itemid = 0;
    }

    break;
  }

  if ( rc && 0 != itemid )
  {
    ON_ERROR("Bug in ON_3dmObjectAttributes::ReadV5Helper or WriteV5Helper");
  }

  return rc;
}